

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.h
# Opt level: O1

ChCoordsys<double> * __thiscall chrono::ChLink::GetLinkRelativeCoords(ChLink *this)

{
  ChCoordsys<double> *in_RDI;
  
  (in_RDI->pos).m_data[0] = CSYSNORM;
  (in_RDI->pos).m_data[1] = DAT_00b90b60;
  (in_RDI->pos).m_data[2] = DAT_00b90b68;
  (in_RDI->rot).m_data[0] = DAT_00b90b70;
  (in_RDI->rot).m_data[1] = DAT_00b90b78;
  (in_RDI->rot).m_data[2] = DAT_00b90b80;
  (in_RDI->rot).m_data[3] = DAT_00b90b88;
  return in_RDI;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() { return CSYSNORM; }